

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

PackagePreset * __thiscall
cmake::FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
          (cmake *this,static_string_view type,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
          *presets,WorkflowStep *step)

{
  const_iterator cVar1;
  string *psVar2;
  char *pcVar3;
  size_t sVar4;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  string local_e8;
  string local_c8;
  basic_string_view<char,_std::char_traits<char>_> local_98;
  size_t local_88;
  char *local_80;
  undefined8 local_78;
  char *local_70;
  size_type local_68;
  pointer local_60;
  undefined8 local_58;
  char *local_50;
  size_type local_48;
  pointer local_40;
  undefined8 local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_30;
  
  pcVar3 = type.super_string_view._M_str;
  sVar4 = type.super_string_view._M_len;
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
          ::find(&presets->_M_t,&step->PresetName);
  local_88 = sVar4;
  local_80 = pcVar3;
  if ((_Rb_tree_header *)cVar1._M_node == &(presets->_M_t)._M_impl.super__Rb_tree_header) {
    psVar2 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_98._M_len = 8;
    local_98._M_str = "No such ";
    local_78 = 0xb;
    local_70 = " preset in ";
    local_60 = (psVar2->_M_dataplus)._M_p;
    local_68 = psVar2->_M_string_length;
    local_58 = 3;
    local_50 = ": \"";
    local_40 = (step->PresetName)._M_dataplus._M_p;
    local_48 = (step->PresetName)._M_string_length;
    local_c8._M_string_length = (size_type)&local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)0x1;
    local_c8.field_2._M_local_buf[0] = '\"';
    local_38 = 1;
    views_00._M_len = 7;
    views_00._M_array = &local_98;
    local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8._M_string_length;
    cmCatViews_abi_cxx11_(&local_e8,views_00);
    cmSystemTools::Error(&local_e8);
  }
  else if ((char)cVar1._M_node[4]._M_color == _S_black) {
    psVar2 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_98._M_len = 0x12;
    local_98._M_str = "Cannot use hidden ";
    local_78 = 0xb;
    local_70 = " preset in ";
    local_60 = (psVar2->_M_dataplus)._M_p;
    local_68 = psVar2->_M_string_length;
    local_58 = 3;
    local_50 = ": \"";
    local_40 = (step->PresetName)._M_dataplus._M_p;
    local_48 = (step->PresetName)._M_string_length;
    local_c8._M_string_length = (size_type)&local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)0x1;
    local_c8.field_2._M_local_buf[0] = '\"';
    local_38 = 1;
    views._M_len = 7;
    views._M_array = &local_98;
    local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8._M_string_length;
    cmCatViews_abi_cxx11_(&local_e8,views);
    cmSystemTools::Error(&local_e8);
  }
  else {
    if (*(char *)&cVar1._M_node[0x22]._M_left == '\0') {
      local_98._M_len = 0x13;
      local_98._M_str = "Could not evaluate ";
      local_78 = 9;
      local_70 = " preset \"";
      local_60 = (step->PresetName)._M_dataplus._M_p;
      local_68 = (step->PresetName)._M_string_length;
      local_58 = 0x1a;
      local_50 = "\": Invalid macro expansion";
      views_01._M_len = 5;
      views_01._M_array = &local_98;
      cmCatViews_abi_cxx11_(&local_c8,views_01);
      cmSystemTools::Error(&local_c8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
        return (PackagePreset *)0x0;
      }
      local_e8.field_2._M_allocated_capacity =
           CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,local_c8.field_2._M_local_buf[0]);
      local_e8._M_dataplus._M_p = local_c8._M_dataplus._M_p;
      goto LAB_002aaa41;
    }
    if (*(char *)&cVar1._M_node[0x17]._M_parent != '\0') {
      return (PackagePreset *)&cVar1._M_node[0x12]._M_parent;
    }
    psVar2 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_98._M_len = 0x14;
    local_98._M_str = "Cannot use disabled ";
    local_78 = 0xb;
    local_70 = " preset in ";
    local_60 = (psVar2->_M_dataplus)._M_p;
    local_68 = psVar2->_M_string_length;
    local_58 = 3;
    local_50 = ": \"";
    local_40 = (step->PresetName)._M_dataplus._M_p;
    local_48 = (step->PresetName)._M_string_length;
    local_c8._M_string_length = (size_type)&local_c8.field_2;
    local_c8._M_dataplus._M_p = (pointer)0x1;
    local_c8.field_2._M_local_buf[0] = '\"';
    local_38 = 1;
    views_02._M_len = 7;
    views_02._M_array = &local_98;
    local_30 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_c8._M_string_length;
    cmCatViews_abi_cxx11_(&local_e8,views_02);
    cmSystemTools::Error(&local_e8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
    return (PackagePreset *)0x0;
  }
LAB_002aaa41:
  operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  return (PackagePreset *)0x0;
}

Assistant:

const T* cmake::FindPresetForWorkflow(
  cm::static_string_view type,
  const std::map<std::string, cmCMakePresetsGraph::PresetPair<T>>& presets,
  const cmCMakePresetsGraph::WorkflowPreset::WorkflowStep& step)
{
  auto it = presets.find(step.PresetName);
  if (it == presets.end()) {
    cmSystemTools::Error(cmStrCat("No such ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (it->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  if (!it->second.Expanded) {
    cmSystemTools::Error(cmStrCat("Could not evaluate ", type, " preset \"",
                                  step.PresetName,
                                  "\": Invalid macro expansion"));
    return nullptr;
  }

  if (!it->second.Expanded->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled ", type, " preset in ",
                                  this->GetHomeDirectory(), ": \"",
                                  step.PresetName, '"'));
    return nullptr;
  }

  return &*it->second.Expanded;
}